

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O1

void __thiscall
sc_core::sc_inout<sc_dt::sc_logic>::add_trace_internal
          (sc_inout<sc_dt::sc_logic> *this,sc_trace_file *tf_,string *name_)

{
  pointer *pppsVar1;
  vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_> *this_00;
  pointer pcVar2;
  iterator __position;
  sc_trace_params_vec *psVar3;
  sc_trace_params *psVar4;
  sc_trace_params *local_28;
  
  if (tf_ != (sc_trace_file *)0x0) {
    if (this->m_traces == (sc_trace_params_vec *)0x0) {
      psVar3 = (sc_trace_params_vec *)operator_new(0x18);
      (psVar3->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (psVar3->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (psVar3->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_traces = psVar3;
    }
    this_00 = this->m_traces;
    psVar4 = (sc_trace_params *)operator_new(0x28);
    psVar4->tf = tf_;
    (psVar4->name)._M_dataplus._M_p = (pointer)&(psVar4->name).field_2;
    pcVar2 = (name_->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&psVar4->name,pcVar2,pcVar2 + name_->_M_string_length);
    __position._M_current =
         (this_00->
         super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->
        super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_28 = psVar4;
      std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::
      _M_realloc_insert(this_00,__position,&local_28);
    }
    else {
      *__position._M_current = psVar4;
      pppsVar1 = &(this_00->
                  super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppsVar1 = *pppsVar1 + 1;
    }
  }
  return;
}

Assistant:

void
sc_inout<sc_dt::sc_logic>::add_trace_internal( sc_trace_file* tf_,
			       const std::string& name_ ) const
{
    if( tf_ != 0 ) {
	if( m_traces == 0 ) {
	    m_traces = new sc_trace_params_vec;
	}
	m_traces->push_back( new sc_trace_params( tf_, name_ ) );
    }
}